

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O1

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createAsm(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  raw_ostream *this_00;
  pair<std::__detail::_Node_iterator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false,_false>,_bool>
  pVar1;
  StringRef Str;
  PSNode *local_28;
  Instruction *local_20;
  
  if (createAsm(llvm::Instruction_const*)::warned == '\0') {
    this_00 = (raw_ostream *)llvm::errs();
    Str.Length = 0x35;
    Str.Data = "PTA: Inline assembly found, analysis  may be unsound\n";
    llvm::raw_ostream::operator<<(this_00,Str);
    createAsm(llvm::Instruction_const*)::warned = '\x01';
  }
  local_28 = PointerGraph::create<(dg::pta::PSNodeType)18,dg::pta::PSNode*&,unsigned_long_const&>
                       ((PointerGraph *)this,(PSNode **)&UNKNOWN_MEMORY,&Offset::UNKNOWN);
  local_28->pairedNode = local_28;
  local_20 = Inst;
  pVar1 = std::
          _Hashtable<llvm::Value_const*,std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,std::allocator<std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>>,std::__detail::_Select1st,std::equal_to<llvm::Value_const*>,std::hash<llvm::Value_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<llvm::Value_const*&,dg::pta::PSNode*&>
                    ((_Hashtable<llvm::Value_const*,std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,std::allocator<std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>>,std::__detail::_Select1st,std::equal_to<llvm::Value_const*>,std::hash<llvm::Value_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)(this + 0x188),&local_20,&local_28);
  (local_28->super_SubgraphNode<dg::pta::PSNode>).user_data = local_20;
  return (PSNodesSeq *)
         ((long)pVar1.first.
                super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
                ._M_cur.
                super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
         + 0x10);
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createAsm(const llvm::Instruction *Inst) {
    // we filter irrelevant calls in isRelevantCall()
    // and we don't have assembler there at all. If
    // we are here, then we got here because this
    // is undefined call that returns pointer.
    // In this case return an unknown pointer
    static bool warned = false;
    if (!warned) {
        llvm::errs()
                << "PTA: Inline assembly found, analysis  may be unsound\n";
        warned = true;
    }

    PSNode *n =
            PS.create<PSNodeType::CONSTANT>(UNKNOWN_MEMORY, Offset::UNKNOWN);
    // it is call that returns pointer, so we'd like to have
    // a 'return' node that contains that pointer
    n->setPairedNode(n);
    return addNode(Inst, n);
}